

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

bool __thiscall gl4cts::GetTextureSubImage::Errors::testExistingTextureObjectError(Errors *this)

{
  char cVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  char *local_360;
  MessageBuilder local_358;
  uint local_1d4;
  char *pcStack_1d0;
  GLint is_proper_error_compressed;
  MessageBuilder local_1b8;
  uint local_34;
  int local_30;
  GLint is_proper_error;
  GLint error_value;
  GLuint invalid_texture;
  Functions *gl;
  Errors *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  _error_value = CONCAT44(extraout_var,iVar2);
  is_proper_error = this->m_texture_2D_multisampled;
  do {
    is_proper_error = is_proper_error + 1;
    cVar1 = (**(code **)(_error_value + 0xcc8))();
  } while (cVar1 != '\0');
  (*this->m_gl_GetTextureSubImage)
            (is_proper_error,0,0,0,0,2,2,1,0x1908,0x1401,0x10,this->m_destination_buffer);
  local_30 = (**(code **)(_error_value + 0x800))();
  local_34 = (uint)(local_30 == 0x501);
  if (local_34 == 0) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [180])
                        "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if texture is not the name of an existing texture object (OpenGL 4.5 Core Specification chapter 8.11.4)."
                       );
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [27])0x29c4368);
    pcStack_1d0 = glu::getErrorName(local_30);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stack0xfffffffffffffe30);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])0x29dd1c0);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  (*this->m_gl_GetCompressedTextureSubImage)
            (is_proper_error,0,0,0,0,4,4,1,0x10,this->m_destination_buffer);
  local_30 = (**(code **)(_error_value + 0x800))();
  local_1d4 = (uint)(local_30 == 0x501);
  if (local_1d4 == 0) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_358,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_358,
                        (char (*) [190])
                        "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if texture is not the name of an existing texture object (OpenGL 4.5 Core Specification chapter 8.11.4)."
                       );
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [27])0x29c4368);
    local_360 = glu::getErrorName(local_30);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_360);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])0x29dd1c0);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
  }
  if ((local_34 == 0) || (local_1d4 == 0)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testExistingTextureObjectError()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare invalid texture name. */
	glw::GLuint invalid_texture = m_texture_2D_multisampled;

	while (gl.isTexture(++invalid_texture))
		;

	m_gl_GetTextureSubImage(invalid_texture, 0, 0, 0, 0, s_texture_data_width, s_texture_data_height, 1, GL_RGBA,
							GL_UNSIGNED_BYTE, s_destination_buffer_size, m_destination_buffer);

	glw::GLint error_value	 = gl.getError();
	glw::GLint is_proper_error = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_INVALID_VALUE error is expected to be generated by "
													   "glGetTextureSubImage if texture is not the name of an existing "
													   "texture object (OpenGL 4.5 Core Specification chapter 8.11.4)."
						   << " However, the error value " << glu::getErrorName(error_value) << " was generated."
						   << tcu::TestLog::EndMessage;
	}

	m_gl_GetCompressedTextureSubImage(invalid_texture, 0, 0, 0, 0, s_texture_data_compressed_width,
									  s_texture_data_compressed_height, 1, s_destination_buffer_size,
									  m_destination_buffer);

	error_value = gl.getError();

	glw::GLint is_proper_error_compressed = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error_compressed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if "
							  "texture is not the name of an existing texture object (OpenGL 4.5 Core Specification "
							  "chapter 8.11.4)."
						   << " However, the error value " << glu::getErrorName(error_value) << " was generated."
						   << tcu::TestLog::EndMessage;
	}

	if (is_proper_error && is_proper_error_compressed)
	{
		return true;
	}

	return false;
}